

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::OperationEncodingString(uint Encoding)

{
  undefined1 auStack_18 [4];
  uint Encoding_local;
  
  if (Encoding == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_addr");
  }
  else if (Encoding == 6) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_deref");
  }
  else if (Encoding == 8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const1u");
  }
  else if (Encoding == 9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const1s");
  }
  else if (Encoding == 10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const2u");
  }
  else if (Encoding == 0xb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const2s");
  }
  else if (Encoding == 0xc) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const4u");
  }
  else if (Encoding == 0xd) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const4s");
  }
  else if (Encoding == 0xe) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const8u");
  }
  else if (Encoding == 0xf) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const8s");
  }
  else if (Encoding == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_constu");
  }
  else if (Encoding == 0x11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_consts");
  }
  else if (Encoding == 0x12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_dup");
  }
  else if (Encoding == 0x13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_drop");
  }
  else if (Encoding == 0x14) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_over");
  }
  else if (Encoding == 0x15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_pick");
  }
  else if (Encoding == 0x16) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_swap");
  }
  else if (Encoding == 0x17) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_rot");
  }
  else if (Encoding == 0x18) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_xderef");
  }
  else if (Encoding == 0x19) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_abs");
  }
  else if (Encoding == 0x1a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_and");
  }
  else if (Encoding == 0x1b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_div");
  }
  else if (Encoding == 0x1c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_minus");
  }
  else if (Encoding == 0x1d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_mod");
  }
  else if (Encoding == 0x1e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_mul");
  }
  else if (Encoding == 0x1f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_neg");
  }
  else if (Encoding == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_not");
  }
  else if (Encoding == 0x21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_or");
  }
  else if (Encoding == 0x22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_plus");
  }
  else if (Encoding == 0x23) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_plus_uconst");
  }
  else if (Encoding == 0x24) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_shl");
  }
  else if (Encoding == 0x25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_shr");
  }
  else if (Encoding == 0x26) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_shra");
  }
  else if (Encoding == 0x27) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_xor");
  }
  else if (Encoding == 0x28) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_bra");
  }
  else if (Encoding == 0x29) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_eq");
  }
  else if (Encoding == 0x2a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_ge");
  }
  else if (Encoding == 0x2b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_gt");
  }
  else if (Encoding == 0x2c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_le");
  }
  else if (Encoding == 0x2d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lt");
  }
  else if (Encoding == 0x2e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_ne");
  }
  else if (Encoding == 0x2f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_skip");
  }
  else if (Encoding == 0x30) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit0");
  }
  else if (Encoding == 0x31) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit1");
  }
  else if (Encoding == 0x32) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit2");
  }
  else if (Encoding == 0x33) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit3");
  }
  else if (Encoding == 0x34) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit4");
  }
  else if (Encoding == 0x35) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit5");
  }
  else if (Encoding == 0x36) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit6");
  }
  else if (Encoding == 0x37) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit7");
  }
  else if (Encoding == 0x38) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit8");
  }
  else if (Encoding == 0x39) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit9");
  }
  else if (Encoding == 0x3a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit10");
  }
  else if (Encoding == 0x3b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit11");
  }
  else if (Encoding == 0x3c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit12");
  }
  else if (Encoding == 0x3d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit13");
  }
  else if (Encoding == 0x3e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit14");
  }
  else if (Encoding == 0x3f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit15");
  }
  else if (Encoding == 0x40) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit16");
  }
  else if (Encoding == 0x41) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit17");
  }
  else if (Encoding == 0x42) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit18");
  }
  else if (Encoding == 0x43) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit19");
  }
  else if (Encoding == 0x44) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit20");
  }
  else if (Encoding == 0x45) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit21");
  }
  else if (Encoding == 0x46) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit22");
  }
  else if (Encoding == 0x47) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit23");
  }
  else if (Encoding == 0x48) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit24");
  }
  else if (Encoding == 0x49) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit25");
  }
  else if (Encoding == 0x4a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit26");
  }
  else if (Encoding == 0x4b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit27");
  }
  else if (Encoding == 0x4c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit28");
  }
  else if (Encoding == 0x4d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit29");
  }
  else if (Encoding == 0x4e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit30");
  }
  else if (Encoding == 0x4f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_lit31");
  }
  else if (Encoding == 0x50) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg0");
  }
  else if (Encoding == 0x51) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg1");
  }
  else if (Encoding == 0x52) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg2");
  }
  else if (Encoding == 0x53) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg3");
  }
  else if (Encoding == 0x54) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg4");
  }
  else if (Encoding == 0x55) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg5");
  }
  else if (Encoding == 0x56) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg6");
  }
  else if (Encoding == 0x57) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg7");
  }
  else if (Encoding == 0x58) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg8");
  }
  else if (Encoding == 0x59) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg9");
  }
  else if (Encoding == 0x5a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg10");
  }
  else if (Encoding == 0x5b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg11");
  }
  else if (Encoding == 0x5c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg12");
  }
  else if (Encoding == 0x5d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg13");
  }
  else if (Encoding == 0x5e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg14");
  }
  else if (Encoding == 0x5f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg15");
  }
  else if (Encoding == 0x60) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg16");
  }
  else if (Encoding == 0x61) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg17");
  }
  else if (Encoding == 0x62) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg18");
  }
  else if (Encoding == 99) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg19");
  }
  else if (Encoding == 100) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg20");
  }
  else if (Encoding == 0x65) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg21");
  }
  else if (Encoding == 0x66) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg22");
  }
  else if (Encoding == 0x67) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg23");
  }
  else if (Encoding == 0x68) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg24");
  }
  else if (Encoding == 0x69) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg25");
  }
  else if (Encoding == 0x6a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg26");
  }
  else if (Encoding == 0x6b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg27");
  }
  else if (Encoding == 0x6c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg28");
  }
  else if (Encoding == 0x6d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg29");
  }
  else if (Encoding == 0x6e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg30");
  }
  else if (Encoding == 0x6f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reg31");
  }
  else if (Encoding == 0x70) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg0");
  }
  else if (Encoding == 0x71) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg1");
  }
  else if (Encoding == 0x72) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg2");
  }
  else if (Encoding == 0x73) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg3");
  }
  else if (Encoding == 0x74) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg4");
  }
  else if (Encoding == 0x75) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg5");
  }
  else if (Encoding == 0x76) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg6");
  }
  else if (Encoding == 0x77) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg7");
  }
  else if (Encoding == 0x78) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg8");
  }
  else if (Encoding == 0x79) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg9");
  }
  else if (Encoding == 0x7a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg10");
  }
  else if (Encoding == 0x7b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg11");
  }
  else if (Encoding == 0x7c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg12");
  }
  else if (Encoding == 0x7d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg13");
  }
  else if (Encoding == 0x7e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg14");
  }
  else if (Encoding == 0x7f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg15");
  }
  else if (Encoding == 0x80) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg16");
  }
  else if (Encoding == 0x81) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg17");
  }
  else if (Encoding == 0x82) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg18");
  }
  else if (Encoding == 0x83) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg19");
  }
  else if (Encoding == 0x84) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg20");
  }
  else if (Encoding == 0x85) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg21");
  }
  else if (Encoding == 0x86) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg22");
  }
  else if (Encoding == 0x87) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg23");
  }
  else if (Encoding == 0x88) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg24");
  }
  else if (Encoding == 0x89) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg25");
  }
  else if (Encoding == 0x8a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg26");
  }
  else if (Encoding == 0x8b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg27");
  }
  else if (Encoding == 0x8c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg28");
  }
  else if (Encoding == 0x8d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg29");
  }
  else if (Encoding == 0x8e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg30");
  }
  else if (Encoding == 0x8f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_breg31");
  }
  else if (Encoding == 0x90) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_regx");
  }
  else if (Encoding == 0x91) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_fbreg");
  }
  else if (Encoding == 0x92) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_bregx");
  }
  else if (Encoding == 0x93) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_piece");
  }
  else if (Encoding == 0x94) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_deref_size");
  }
  else if (Encoding == 0x95) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_xderef_size");
  }
  else if (Encoding == 0x96) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_nop");
  }
  else if (Encoding == 0x97) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_push_object_address");
  }
  else if (Encoding == 0x98) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_call2");
  }
  else if (Encoding == 0x99) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_call4");
  }
  else if (Encoding == 0x9a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_call_ref");
  }
  else if (Encoding == 0x9b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_form_tls_address");
  }
  else if (Encoding == 0x9c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_call_frame_cfa");
  }
  else if (Encoding == 0x9d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_bit_piece");
  }
  else if (Encoding == 0x9e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_implicit_value");
  }
  else if (Encoding == 0x9f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_stack_value");
  }
  else if (Encoding == 0xa0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_implicit_pointer");
  }
  else if (Encoding == 0xa1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_addrx");
  }
  else if (Encoding == 0xa2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_constx");
  }
  else if (Encoding == 0xa3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_entry_value");
  }
  else if (Encoding == 0xa4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_const_type");
  }
  else if (Encoding == 0xa5) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_regval_type");
  }
  else if (Encoding == 0xa6) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_deref_type");
  }
  else if (Encoding == 0xa7) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_xderef_type");
  }
  else if (Encoding == 0xa8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_convert");
  }
  else if (Encoding == 0xa9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_reinterpret");
  }
  else if (Encoding == 0xe0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_GNU_push_tls_address");
  }
  else if (Encoding == 0xed) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_WASM_location");
  }
  else if (Encoding == 0xf3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_GNU_entry_value");
  }
  else if (Encoding == 0xfb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_GNU_addr_index");
  }
  else if (Encoding == 0xfc) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_GNU_const_index");
  }
  else if (Encoding == 0x1000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_LLVM_fragment");
  }
  else if (Encoding == 0x1001) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_LLVM_convert");
  }
  else if (Encoding == 0x1002) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_LLVM_tag_offset");
  }
  else if (Encoding == 0x1003) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_OP_LLVM_entry_value");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::OperationEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  case DW_OP_##NAME:                                                           \
    return "DW_OP_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  case DW_OP_LLVM_convert:
    return "DW_OP_LLVM_convert";
  case DW_OP_LLVM_fragment:
    return "DW_OP_LLVM_fragment";
  case DW_OP_LLVM_tag_offset:
    return "DW_OP_LLVM_tag_offset";
  case DW_OP_LLVM_entry_value:
    return "DW_OP_LLVM_entry_value";
  }
}